

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

String __thiscall
testing::internal::AppendUserMessage(internal *this,String *gtest_msg,Message *user_msg)

{
  bool bVar1;
  Message *this_00;
  size_t extraout_RDX;
  String SVar2;
  String *in_stack_ffffffffffffff90;
  internal *this_01;
  Message local_48;
  Message msg;
  undefined1 local_30 [8];
  String user_msg_string;
  Message *user_msg_local;
  String *gtest_msg_local;
  
  this_01 = this;
  user_msg_string.length_ = (size_t)user_msg;
  Message::GetString((Message *)local_30);
  bVar1 = String::empty((String *)local_30);
  if (bVar1) {
    String::String((String *)this,gtest_msg);
    msg.ss_.ptr_._0_4_ = 1;
  }
  else {
    Message::Message((Message *)this_01);
    in_stack_ffffffffffffff90 = (String *)Message::operator<<(&local_48,gtest_msg);
    this_00 = Message::operator<<((Message *)in_stack_ffffffffffffff90,(char (*) [2])0x14c334);
    Message::operator<<(this_00,(String *)local_30);
    Message::GetString((Message *)this);
    msg.ss_.ptr_._0_4_ = 1;
    Message::~Message((Message *)0x1195f5);
  }
  String::~String(in_stack_ffffffffffffff90);
  SVar2.length_ = extraout_RDX;
  SVar2.c_str_ = (char *)this_01;
  return SVar2;
}

Assistant:

String AppendUserMessage(const String& gtest_msg,
                         const Message& user_msg) {
  // Appends the user message if it's non-empty.
  const String user_msg_string = user_msg.GetString();
  if (user_msg_string.empty()) {
    return gtest_msg;
  }

  Message msg;
  msg << gtest_msg << "\n" << user_msg_string;

  return msg.GetString();
}